

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utMaterialSystem.cpp
# Opt level: O0

void __thiscall
MaterialSystemTest_testStringProperty_Test::TestBody
          (MaterialSystemTest_testStringProperty_Test *this)

{
  aiString *this_00;
  bool bVar1;
  char *pcVar2;
  AssertHelper local_470;
  Message local_468;
  undefined1 local_460 [8];
  AssertionResult gtest_ar_1;
  Message local_448 [3];
  aiReturn local_430 [2];
  undefined1 local_428 [8];
  AssertionResult gtest_ar;
  aiString s;
  MaterialSystemTest_testStringProperty_Test *this_local;
  
  this_00 = (aiString *)((long)&gtest_ar.message_.ptr_ + 4);
  s.data._1016_8_ = this;
  aiString::aiString(this_00);
  aiString::Set(this_00,"Hello, this is a small test");
  aiMaterial::AddProperty((this->super_MaterialSystemTest).pcMat,this_00,"testKey6",0,0);
  aiString::Set(this_00,"358358");
  local_430[1] = 0;
  local_430[0] = aiMaterial::Get((this->super_MaterialSystemTest).pcMat,"testKey6",0,0,this_00);
  testing::internal::EqHelper<false>::Compare<aiReturn,aiReturn>
            ((EqHelper<false> *)local_428,"aiReturn_SUCCESS","pcMat->Get(\"testKey6\",0,0,s)",
             local_430 + 1,local_430);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_428);
  if (!bVar1) {
    testing::Message::Message(local_448);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_428);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMaterialSystem.cpp"
               ,0x7f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_448);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_448);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_428);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_460,"\"Hello, this is a small test\"","s.data",
             "Hello, this is a small test",&stack0xfffffffffffffbf0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_460);
  if (!bVar1) {
    testing::Message::Message(&local_468);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_460);
    testing::internal::AssertHelper::AssertHelper
              (&local_470,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMaterialSystem.cpp"
               ,0x80,pcVar2);
    testing::internal::AssertHelper::operator=(&local_470,&local_468);
    testing::internal::AssertHelper::~AssertHelper(&local_470);
    testing::Message::~Message(&local_468);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_460);
  return;
}

Assistant:

TEST_F(MaterialSystemTest, testStringProperty) {
    aiString s;
    s.Set("Hello, this is a small test");
    this->pcMat->AddProperty(&s,"testKey6");
    s.Set("358358");
    EXPECT_EQ(AI_SUCCESS, pcMat->Get("testKey6",0,0,s));
    EXPECT_STREQ("Hello, this is a small test", s.data);
}